

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventplayer.cxx
# Opt level: O3

void __thiscall EventPlayer::init(EventPlayer *this)

{
  Physical *pPVar1;
  
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  stochDescription._M_dataplus._M_p = (pointer)0x0;
  *(undefined4 *)
   &(this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
    stochDescription._M_string_length = 0;
  pPVar1 = &(this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
            super_Physical;
  (pPVar1->physicalUnit).siUnits[1] = 0;
  (pPVar1->physicalUnit).siUnits[2] = 0;
  pPVar1 = &(this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
            super_Physical;
  (pPVar1->physicalUnit).siUnits[3] = 0;
  (pPVar1->physicalUnit).siUnits[4] = 0;
  return;
}

Assistant:

void EventPlayer::init()
{
	playerBufferPosition = 0;
	playerCurrentValue = 0;
	playerNextValue = 0;
	stochCurrentValue = 0.0;
	stochNextValue = 0.0;
	StochasticEventGenerator::init();
}